

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filtering.cpp
# Opt level: O0

Image * Image_Function::Sobel(Image *in)

{
  ImageTemplate<unsigned_char> *in_RSI;
  ImageTemplate<unsigned_char> *in_RDI;
  Image *out;
  uint32_t in_stack_00000078;
  uint32_t in_stack_0000007c;
  Image *in_stack_00000080;
  uint32_t in_stack_00000088;
  uint32_t in_stack_0000008c;
  Image *in_stack_00000090;
  uint32_t in_stack_000000a0;
  uint32_t in_stack_000000a8;
  uint8_t in_stack_ffffffffffffffa6;
  uint8_t in_stack_ffffffffffffffa7;
  uint32_t in_stack_ffffffffffffffa8;
  uint32_t in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  
  ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            ((ImageTemplate<unsigned_char> *)
             CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  PenguinV_Image::ImageTemplate<unsigned_char>::width(in_RSI);
  PenguinV_Image::ImageTemplate<unsigned_char>::height(in_RSI);
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            ((ImageTemplate<unsigned_char> *)
             CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),in_stack_ffffffffffffffac
             ,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa6);
  PenguinV_Image::ImageTemplate<unsigned_char>::width(in_RDI);
  PenguinV_Image::ImageTemplate<unsigned_char>::height(in_RDI);
  Sobel(in_stack_00000090,in_stack_0000008c,in_stack_00000088,in_stack_00000080,in_stack_0000007c,
        in_stack_00000078,in_stack_000000a0,in_stack_000000a8);
  return in_RDI;
}

Assistant:

Image Sobel( const Image & in )
    {
        ParameterValidation( in );

        Image out( in.width(), in.height() );

        Sobel( in, 0, 0, out, 0, 0, out.width(), out.height() );

        return out;
    }